

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O0

void __thiscall
pstore::region::region_builder<pstore::file::file_handle,_pstore::memory_mapper>::push
          (region_builder<pstore::file::file_handle,_pstore::memory_mapper> *this,
          not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
          regions,uint64_t param_2,uint64_t offset,uint64_t size)

{
  bool bVar1;
  vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
  *this_00;
  element_type *__args_1;
  element_type *this_01;
  undefined1 local_59;
  undefined1 local_58 [32];
  vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
  *local_38;
  ulong local_30;
  uint64_t size_local;
  uint64_t offset_local;
  uint64_t param_2_local;
  region_builder<pstore::file::file_handle,_pstore::memory_mapper> *this_local;
  not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
  regions_local;
  
  local_38 = (vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              *)0x0;
  local_30 = size;
  size_local = offset;
  offset_local = param_2;
  param_2_local = (uint64_t)this;
  this_local = (region_builder<pstore::file::file_handle,_pstore::memory_mapper> *)regions.ptr_;
  bVar1 = gsl::
          not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
          ::operator!=((not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
                        *)&this_local,&local_38);
  if (!bVar1) {
    assert_failed("regions != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                  ,0xa1);
  }
  if (this->minimum_size_ <= local_30) {
    this_00 = gsl::
              not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
              ::operator->((not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
                            *)&this_local);
    __args_1 = std::
               __shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    this_01 = std::
              __shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    local_59 = pstore::file::file_handle::is_writable(this_01);
    std::
    make_shared<pstore::memory_mapper,pstore::file::file_handle&,bool,unsigned_long&,unsigned_long&>
              ((file_handle *)local_58,(bool *)__args_1,(unsigned_long *)&local_59,&size_local);
    std::shared_ptr<pstore::memory_mapper_base>::shared_ptr<pstore::memory_mapper,void>
              ((shared_ptr<pstore::memory_mapper_base> *)(local_58 + 0x10),
               (shared_ptr<pstore::memory_mapper> *)local_58);
    std::
    vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
    ::push_back(this_00,(shared_ptr<pstore::memory_mapper_base> *)(local_58 + 0x10));
    std::shared_ptr<pstore::memory_mapper_base>::~shared_ptr
              ((shared_ptr<pstore::memory_mapper_base> *)(local_58 + 0x10));
    std::shared_ptr<pstore::memory_mapper>::~shared_ptr
              ((shared_ptr<pstore::memory_mapper> *)local_58);
    return;
  }
  assert_failed("size >= minimum_size_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                ,0xa2);
}

Assistant:

void
        region_builder<File, MemoryMapper>::push (gsl::not_null<container_type *> const regions,
                                                  std::uint64_t const /*file_size*/,
                                                  std::uint64_t offset, std::uint64_t size) {
            PSTORE_ASSERT (regions != nullptr);
            PSTORE_ASSERT (size >= minimum_size_);
            // (Note that we separately make pages read-only to guard against writing to committed
            // transactions: that's done by database::protect() rather than here.)
            regions->push_back (
                std::make_shared<MemoryMapper> (*file_, file_->is_writable (), offset, size));
        }